

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
          (ExtensionSet *this,int number,int index)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  Type *pTVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0x224);
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: extension != NULL: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_21,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  if (pEVar2->is_repeated == false) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0x225);
    pLVar3 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                       );
    LogFinisher::operator=(&local_21,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  CVar1 = anon_unknown_22::cpp_type(pEVar2->type);
  if (CVar1 != CPPTYPE_STRING) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0x225);
    pLVar3 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                       );
    LogFinisher::operator=(&local_21,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  pTVar4 = RepeatedPtrFieldBase::
           Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(pEVar2->field_0).string_value,index);
  return pTVar4;
}

Assistant:

std::string* ExtensionSet::MutableRepeatedString(int number, int index) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  return extension->repeated_string_value->Mutable(index);
}